

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

char * parse_int(char *src)

{
  bool bVar1;
  runtime_error *this;
  char *in_RDI;
  char *pos;
  char *__rhs;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff9c;
  char local_51 [17];
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    bVar1 = is_digit_char(*local_10);
    if (!bVar1) break;
    local_10 = local_10 + 1;
  }
  if (local_10 == in_RDI) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff9c,uVar2),__rhs);
    std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffffd0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_10;
}

Assistant:

static const char * parse_int(const char * src) {
    const char * pos = src;
    while (is_digit_char(*pos)) {
        pos++;
    }
    if (pos == src) {
        throw std::runtime_error(std::string("expecting integer at ") + src);
    }
    return pos;
}